

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O0

void __thiscall
kratos::Generator::add_function(Generator *this,shared_ptr<kratos::FunctionStmtBlock> *func)

{
  initializer_list<kratos::IRNode_*> __l;
  bool bVar1;
  element_type *peVar2;
  StmtException *this_00;
  __shared_ptr<kratos::FunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2> *this_01;
  size_type sVar3;
  remove_reference_t<std::__cxx11::basic_string<char>_&> *in_R8;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  format_args args;
  string_view format_str;
  uint local_148;
  undefined1 local_142;
  allocator<kratos::IRNode_*> local_141;
  element_type *local_140;
  element_type *local_138;
  element_type **local_130;
  size_type local_128;
  vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_> local_120;
  string local_108;
  _Self local_e8 [3];
  _Self local_d0;
  undefined1 local_c8 [8];
  string func_name;
  shared_ptr<kratos::FunctionStmtBlock> *func_local;
  Generator *this_local;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  local_90;
  basic_string_view<char> local_88;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_78;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_58;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *vargs;
  char (*local_48) [35];
  char *local_40;
  string *local_38;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_30;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_28;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_20;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_18;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_10;
  
  func_name.field_2._8_8_ = func;
  peVar2 = std::
           __shared_ptr_access<kratos::FunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<kratos::FunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)func);
  FunctionStmtBlock::function_name_abi_cxx11_((string *)local_c8,peVar2);
  local_d0._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::FunctionStmtBlock>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::FunctionStmtBlock>_>_>_>
       ::find(&this->funcs_,(string *)local_c8);
  local_e8[0]._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::FunctionStmtBlock>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::FunctionStmtBlock>_>_>_>
       ::end(&this->funcs_);
  bVar1 = std::operator!=(&local_d0,local_e8);
  if (!bVar1) {
    sVar3 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::FunctionStmtBlock>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::FunctionStmtBlock>_>_>_>
            ::size(&this->funcs_);
    local_148 = (uint)sVar3;
    std::
    map<unsigned_int,std::__cxx11::string,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,std::__cxx11::string>>>
    ::emplace<unsigned_int,std::__cxx11::string&>
              ((map<unsigned_int,std::__cxx11::string,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,std::__cxx11::string>>>
                *)&this->func_index_,&local_148,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8);
    std::
    map<std::__cxx11::string,std::shared_ptr<kratos::FunctionStmtBlock>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::FunctionStmtBlock>>>>
    ::emplace<std::__cxx11::string&,std::shared_ptr<kratos::FunctionStmtBlock>const&>
              ((map<std::__cxx11::string,std::shared_ptr<kratos::FunctionStmtBlock>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::FunctionStmtBlock>>>>
                *)&this->funcs_,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8,
               (shared_ptr<kratos::FunctionStmtBlock> *)func_name.field_2._8_8_);
    peVar2 = std::
             __shared_ptr_access<kratos::FunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<kratos::FunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)func_name.field_2._8_8_);
    (*(peVar2->super_StmtBlock).super_Stmt.super_IRNode._vptr_IRNode[7])(peVar2,this);
    std::__cxx11::string::~string((string *)local_c8);
    return;
  }
  local_142 = 1;
  this_00 = (StmtException *)__cxa_allocate_exception(0x10);
  vargs = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&this->instance_name;
  local_38 = &local_108;
  local_40 = "Function {0} already exists in {1}";
  local_48 = (char (*) [35])local_c8;
  fmt::v7::make_args_checked<std::__cxx11::string&,std::__cxx11::string&,char[35],char>
            (&local_78,(v7 *)"Function {0} already exists in {1}",local_48,
             (remove_reference_t<std::__cxx11::basic_string<char>_&> *)vargs,in_R8);
  local_58 = &local_78;
  local_88 = fmt::v7::to_string_view<char,_0>(local_40);
  local_28 = (basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
              *)&this_local;
  local_30 = local_58;
  local_20 = local_58;
  local_10 = local_58;
  local_18 = local_28;
  fmt::v7::
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>::
  basic_format_args(local_28,0xdd,
                    (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                     *)local_58);
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .field_1.values_ = in_R9.values_;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .desc_ = (unsigned_long_long)local_90.values_;
  format_str.size_ = (size_t)this_local;
  format_str.data_ = (char *)local_88.size_;
  fmt::v7::detail::vformat_abi_cxx11_(&local_108,(detail *)local_88.data_,format_str,args);
  local_140 = std::__shared_ptr<kratos::FunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2>::get
                        ((__shared_ptr<kratos::FunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2> *)
                         func_name.field_2._8_8_);
  this_01 = &std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::FunctionStmtBlock>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::FunctionStmtBlock>_>_>_>
             ::at(&this->funcs_,(key_type *)local_c8)->
             super___shared_ptr<kratos::FunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2>;
  local_138 = std::__shared_ptr<kratos::FunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2>::get(this_01)
  ;
  local_130 = &local_140;
  local_128 = 2;
  std::allocator<kratos::IRNode_*>::allocator(&local_141);
  __l._M_len = local_128;
  __l._M_array = (iterator)local_130;
  std::vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>::vector
            (&local_120,__l,&local_141);
  StmtException::StmtException(this_00,&local_108,&local_120);
  local_142 = 0;
  __cxa_throw(this_00,&StmtException::typeinfo,StmtException::~StmtException);
}

Assistant:

void Generator::add_function(const std::shared_ptr<FunctionStmtBlock> &func) {
    auto func_name = func->function_name();
    if (funcs_.find(func_name) != funcs_.end())
        throw StmtException(
            ::format("Function {0} already exists in {1}", func_name, instance_name),
            {func.get(), funcs_.at(func_name).get()});
    func_index_.emplace(static_cast<uint32_t>(funcs_.size()), func_name);
    funcs_.emplace(func_name, func);
    // change the parent
    func->set_parent(this);
}